

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

void PrintIOExp(uint32_t iodata)

{
  long lVar1;
  ostream *poVar2;
  
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  :",3);
  if ((iodata >> 0x18 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," output_error (",0xf);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
  }
  if ((iodata >> 0x19 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," read_error",0xb);
  }
  if ((iodata >> 0x1a & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," do_reg_io",10);
  }
  if ((iodata >> 0x1b & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reg_io_read",0xc);
  }
  if ((iodata >> 0x1c & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," other_busy",0xb);
  }
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return;
}

Assistant:

void PrintIOExp(uint32_t iodata)
{
    std::cout << std::hex << (iodata&0x0000ffff) << "  :";
    bool output_error = iodata&0x01000000;
    if (output_error)
        std::cout << " output_error (" << ((iodata&0x00ff0000)>>16) << ") ";
    if (iodata&0x02000000) std::cout << " read_error";
    if (iodata&0x04000000) std::cout << " do_reg_io";
    if (iodata&0x08000000) std::cout << " reg_io_read";
    if (iodata&0x10000000) std::cout << " other_busy";
    std::cout << std::dec << std::endl;
}